

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::CastToFloat(VirtualMachine *this)

{
  Variable VVar1;
  allocator<char> local_59;
  string local_58;
  double local_28;
  double val;
  Variable top;
  VirtualMachine *this_local;
  
  top.field_1 = (anon_union_8_6_52c89740_for_Variable_1)this;
  VVar1 = popOpStack(this);
  top._0_8_ = VVar1.field_1;
  val._0_4_ = VVar1.type;
  switch(val._0_4_) {
  case Undefined:
    pushUndefined(this);
    break;
  case Integer:
    pushFloat(this,(double)(long)top._0_8_);
    break;
  case Boolean:
    pushUndefined(this);
    break;
  case Float:
    pushFloat(this,(double)top._0_8_);
    break;
  case String:
    local_28 = std::__cxx11::stod((string *)top._0_8_,(size_t *)0x0);
    pushFloat(this,local_28);
    break;
  case Object:
    pushUndefined(this);
    break;
  case Function:
    pushUndefined(this);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Unknown varible type at variableEquals",&local_59);
    panic(this,&local_58);
  }
  advance(this);
  return;
}

Assistant:

void runtime::VirtualMachine::CastToFloat() {
  Variable top = this->popOpStack();

  switch (top.type) {
    case VariableType::Integer: {
      this->pushFloat(static_cast<double>(top.integerValue));
      break;
    }
    case VariableType::Float: {
      this->pushFloat(top.doubleValue);
      break;
    }
    case VariableType::Function: {
      this->pushUndefined();
      break;
    }
    case VariableType::Object: {
      this->pushUndefined();
      break;
    }
    case VariableType::String: {
      try {
        double val = std::stod(*top.stringValue);
        this->pushFloat(val);

      } catch (...) {
        this->pushUndefined();
      }
      break;
    }
    case VariableType::Undefined: {
      this->pushUndefined();
      break;
    }
    case VariableType::Boolean: {
      this->pushUndefined();
      break;
    }
    default: {
      this->panic("Unknown varible type at variableEquals");
    }
  }

  this->advance();
}